

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O2

void aom_avg_8x8_quad_c(uint8_t *s,int p,int x16_idx,int y16_idx,int *avg)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  
  uVar3 = 0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
    uVar1 = aom_avg_8x8_c(s + (long)(int)((((uint)lVar2 & 8) + y16_idx) * p) +
                              (long)(int)((uVar3 & 8) + x16_idx),p);
    *(uint *)((long)avg + lVar2) = uVar1;
    uVar3 = uVar3 + 8;
  }
  return;
}

Assistant:

void aom_avg_8x8_quad_c(const uint8_t *s, int p, int x16_idx, int y16_idx,
                        int *avg) {
  for (int k = 0; k < 4; k++) {
    const int x8_idx = x16_idx + ((k & 1) << 3);
    const int y8_idx = y16_idx + ((k >> 1) << 3);
    const uint8_t *s_tmp = s + y8_idx * p + x8_idx;
    avg[k] = aom_avg_8x8_c(s_tmp, p);
  }
}